

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

int __thiscall QListModeViewBase::verticalOffset(QListModeViewBase *this)

{
  bool bVar1;
  ScrollMode SVar2;
  Flow FVar3;
  int iVar4;
  int iVar5;
  qsizetype qVar6;
  const_reference piVar7;
  QCommonListViewBase *in_RDI;
  int value_1;
  int value;
  qsizetype in_stack_ffffffffffffffb8;
  QCommonListViewBase *i;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  SVar2 = QCommonListViewBase::verticalScrollMode((QCommonListViewBase *)0x88268c);
  if (SVar2 == ScrollPerItem) {
    bVar1 = QCommonListViewBase::isWrapping((QCommonListViewBase *)0x88269f);
    if (bVar1) {
      FVar3 = QCommonListViewBase::flow(in_RDI);
      if ((FVar3 == LeftToRight) && (bVar1 = QList<int>::isEmpty((QList<int> *)0x8826c9), !bVar1)) {
        QCommonListViewBase::verticalScrollBar((QCommonListViewBase *)0x8826d7);
        iVar4 = QAbstractSlider::value
                          ((QAbstractSlider *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        qVar6 = QList<int>::size((QList<int> *)&in_RDI[1].contentsSize);
        if (qVar6 <= iVar4) {
          return 0;
        }
        piVar7 = QList<int>::at((QList<int> *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
        iVar4 = *piVar7;
        iVar5 = QCommonListViewBase::spacing((QCommonListViewBase *)0x882738);
        return iVar4 - iVar5;
      }
    }
    else {
      FVar3 = QCommonListViewBase::flow(in_RDI);
      if ((FVar3 == TopToBottom) && (bVar1 = QList<int>::isEmpty((QList<int> *)0x88276f), !bVar1)) {
        QCommonListViewBase::verticalScrollBar((QCommonListViewBase *)0x882781);
        iVar4 = QAbstractSlider::value
                          ((QAbstractSlider *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        qVar6 = QList<int>::size((QList<int> *)&in_RDI[3].qq);
        if (qVar6 < iVar4) {
          return 0;
        }
        i = in_RDI + 1;
        QList<int>::at((QList<int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (qsizetype)i);
        piVar7 = QList<int>::at((QList<int> *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                (qsizetype)i);
        iVar4 = *piVar7;
        iVar5 = QCommonListViewBase::spacing((QCommonListViewBase *)0x8827fc);
        return iVar4 - iVar5;
      }
    }
  }
  iVar4 = QCommonListViewBase::verticalOffset((QCommonListViewBase *)0x882818);
  return iVar4;
}

Assistant:

int QListModeViewBase::verticalOffset() const
{
    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        if (isWrapping()) {
            if (flow() == QListView::LeftToRight && !segmentPositions.isEmpty()) {
                int value = verticalScrollBar()->value();
                if (value >= segmentPositions.size())
                    return 0;
                return segmentPositions.at(value) - spacing();
            }
        } else if (flow() == QListView::TopToBottom && !flowPositions.isEmpty()) {
            int value = verticalScrollBar()->value();
            if (value > scrollValueMap.size())
                return 0;
            return flowPositions.at(scrollValueMap.at(value)) - spacing();
        }
    }
    return QCommonListViewBase::verticalOffset();
}